

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

string * vkt::anon_unknown_0::specializeVertexShader
                   (string *__return_storage_ptr__,ShaderCaseSpecification *spec,string *src)

{
  DataType DVar1;
  DataType DVar2;
  int iVar3;
  Value *pVVar4;
  const_reference pvVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  const_reference pvVar9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var10;
  undefined1 local_720 [8];
  string baseSrc;
  StringTemplate tmpl;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d0;
  _Base_ptr local_690;
  undefined1 local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_660;
  _Base_ptr local_620;
  undefined1 local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f0;
  _Base_ptr local_5b0;
  undefined1 local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_580;
  undefined1 local_540 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  int numLocs_1;
  char *transportTypeStr_1;
  DataType transportType_1;
  char *valueTypeStr_1;
  DataType valueType_1;
  Value *val_1;
  size_t ndx_1;
  int numLocs;
  char *transportTypeStr;
  DataType transportType;
  char *valueTypeStr;
  DataType valueType;
  Value *val;
  size_t ndx;
  int curOutputLoc;
  int curInputLoc;
  ostringstream output;
  ostringstream local_310 [8];
  ostringstream setup;
  ostringstream local_198 [8];
  ostringstream decl;
  string *src_local;
  ShaderCaseSpecification *spec_local;
  string *withExt;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_310);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&curOutputLoc);
  ndx._0_4_ = 0;
  std::operator<<((ostream *)&curOutputLoc,"gl_Position = dEQP_Position;\n");
  std::operator<<((ostream *)local_198,"layout(location = 0) in highp vec4 dEQP_Position;\n");
  ndx._4_4_ = 1;
  for (val = (Value *)0x0;
      pVVar4 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                  (&(spec->values).inputs), val < pVVar4;
      val = (Value *)((long)&(val->type).m_type + 1)) {
    pvVar5 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                       (&(spec->values).inputs,(size_type)val);
    DVar1 = glu::VarType::getBasicType(&pvVar5->type);
    pcVar6 = glu::getDataTypeName(DVar1);
    DVar2 = getTransportType(DVar1);
    pcVar7 = glu::getDataTypeName(DVar2);
    iVar3 = getNumTransportLocations(DVar1);
    poVar8 = std::operator<<((ostream *)local_198,"layout(location = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,ndx._4_4_);
    std::operator<<(poVar8,") in ");
    ndx._4_4_ = iVar3 + ndx._4_4_;
    if (DVar1 == DVar2) {
      poVar8 = std::operator<<((ostream *)local_198,pcVar7);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      std::operator<<(poVar8,";\n");
    }
    else {
      poVar8 = std::operator<<((ostream *)local_198,pcVar7);
      poVar8 = std::operator<<(poVar8," a_");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      std::operator<<(poVar8,";\n");
      poVar8 = std::operator<<((ostream *)local_310,pcVar6);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = std::operator<<(poVar8,pcVar6);
      poVar8 = std::operator<<(poVar8,"(a_");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      std::operator<<(poVar8,");\n");
    }
  }
  declareUniforms((ostringstream *)local_198,&spec->values);
  for (val_1 = (Value *)0x0;
      pVVar4 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                  (&(spec->values).outputs), val_1 < pVVar4;
      val_1 = (Value *)((long)&(val_1->type).m_type + 1)) {
    pvVar5 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                       (&(spec->values).outputs,(size_type)val_1);
    DVar1 = glu::VarType::getBasicType(&pvVar5->type);
    pcVar6 = glu::getDataTypeName(DVar1);
    DVar2 = getTransportType(DVar1);
    pcVar7 = glu::getDataTypeName(DVar2);
    params._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = getNumTransportLocations(DVar1);
    poVar8 = std::operator<<((ostream *)local_198,"layout(location = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)ndx);
    std::operator<<(poVar8,") flat out ");
    ndx._0_4_ = params._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + (int)ndx;
    if (DVar1 == DVar2) {
      poVar8 = std::operator<<((ostream *)local_198,pcVar7);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      std::operator<<(poVar8,";\n");
    }
    else {
      poVar8 = std::operator<<((ostream *)local_198,pcVar7);
      poVar8 = std::operator<<(poVar8," v_");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      std::operator<<(poVar8,";\n");
      poVar8 = std::operator<<((ostream *)local_198,pcVar6);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      std::operator<<(poVar8,";\n");
      poVar8 = std::operator<<((ostream *)&curOutputLoc,"v_");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = std::operator<<(poVar8,pcVar7);
      poVar8 = std::operator<<(poVar8,"(");
      poVar8 = std::operator<<(poVar8,(string *)&pvVar5->name);
      std::operator<<(poVar8,");\n");
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_540);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_580,(char (*) [13])0x12bde3a,&local_5a0);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_540,&local_580);
  local_5b0 = (_Base_ptr)_Var10.first._M_node;
  local_5a8 = _Var10.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_580);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_5f0,(char (*) [6])0x12bdc83,&local_610);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_540,&local_5f0);
  local_620 = (_Base_ptr)_Var10.first._M_node;
  local_618 = _Var10.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_5f0);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_660,(char (*) [7])0x137ac60,&local_680);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_540,&local_660);
  local_690 = (_Base_ptr)_Var10.first._M_node;
  local_688 = _Var10.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_660);
  std::__cxx11::string::~string((string *)&local_680);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[12],_true>
            (&local_6d0,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [12])0x1339197);
  std::
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)local_540,&local_6d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_6d0);
  tcu::StringTemplate::StringTemplate((StringTemplate *)((long)&baseSrc.field_2 + 8),src);
  tcu::StringTemplate::specialize
            ((string *)local_720,(StringTemplate *)((long)&baseSrc.field_2 + 8),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_540);
  pvVar9 = std::
           vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
           operator[](&spec->programs,0);
  glu::sl::injectExtensionRequirements
            (__return_storage_ptr__,(string *)local_720,&pvVar9->requiredExtensions,
             SHADERTYPE_VERTEX);
  std::__cxx11::string::~string((string *)local_720);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)((long)&baseSrc.field_2 + 8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&curOutputLoc);
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string specializeVertexShader (const ShaderCaseSpecification& spec, const string& src)
{
	ostringstream		decl;
	ostringstream		setup;
	ostringstream		output;
	int					curInputLoc		= 0;
	int					curOutputLoc	= 0;

	// generated from "both" case
	DE_ASSERT(spec.caseType == glu::sl::CASETYPE_VERTEX_ONLY);

	// Output (write out position).
	output << "gl_Position = dEQP_Position;\n";

	// Declarations (position + attribute for each input, varying for each output).
	decl << "layout(location = 0) in highp vec4 dEQP_Position;\n";
	curInputLoc += 1;

	for (size_t ndx = 0; ndx < spec.values.inputs.size(); ndx++)
	{
		const Value&		val					= spec.values.inputs[ndx];
		const DataType		valueType			= val.type.getBasicType();
		const char*	const	valueTypeStr		= getDataTypeName(valueType);
		const DataType		transportType		= getTransportType(valueType);
		const char* const	transportTypeStr	= getDataTypeName(transportType);
		const int			numLocs				= getNumTransportLocations(valueType);

		decl << "layout(location = " << curInputLoc << ") in ";

		curInputLoc += numLocs;

		if (valueType == transportType)
			decl << transportTypeStr << " " << val.name << ";\n";
		else
		{
			decl << transportTypeStr << " a_" << val.name << ";\n";
			setup << valueTypeStr << " " << val.name << " = " << valueTypeStr << "(a_" << val.name << ");\n";
		}
	}

	declareUniforms(decl, spec.values);

	for (size_t ndx = 0; ndx < spec.values.outputs.size(); ndx++)
	{
		const Value&		val					= spec.values.outputs[ndx];
		const DataType		valueType			= val.type.getBasicType();
		const char*	const	valueTypeStr		= getDataTypeName(valueType);
		const DataType		transportType		= getTransportType(valueType);
		const char* const	transportTypeStr	= getDataTypeName(transportType);
		const int			numLocs				= getNumTransportLocations(valueType);

		decl << "layout(location = " << curOutputLoc << ") flat out ";

		curOutputLoc += numLocs;

		if (valueType == transportType)
			decl << transportTypeStr << " " << val.name << ";\n";
		else
		{
			decl << transportTypeStr << " v_" << val.name << ";\n";
			decl << valueTypeStr << " " << val.name << ";\n";

			output << "v_" << val.name << " = " << transportTypeStr << "(" << val.name << ");\n";
		}
	}

	// Shader specialization.
	map<string, string> params;
	params.insert(pair<string, string>("DECLARATIONS", decl.str()));
	params.insert(pair<string, string>("SETUP", setup.str()));
	params.insert(pair<string, string>("OUTPUT", output.str()));
	params.insert(pair<string, string>("POSITION_FRAG_COLOR", "gl_Position"));

	StringTemplate	tmpl	(src);
	const string	baseSrc	= tmpl.specialize(params);
	const string	withExt	= injectExtensionRequirements(baseSrc, spec.programs[0].requiredExtensions, glu::SHADERTYPE_VERTEX);

	return withExt;
}